

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O1

int secp256r1_create_key_exchange(ptls_key_exchange_context_t **_ctx,ptls_iovec_t *pubkey)

{
  int iVar1;
  ptls_key_exchange_context_t *ppVar2;
  uECC_Curve curve;
  
  ppVar2 = (ptls_key_exchange_context_t *)malloc(0x70);
  if (ppVar2 == (ptls_key_exchange_context_t *)0x0) {
    iVar1 = 0x201;
  }
  else {
    ppVar2->on_exchange = secp256r1_on_exchange;
    *(undefined1 *)&ppVar2[5].on_exchange = 4;
    curve = uECC_secp256r1();
    uECC_make_key((uint8_t *)((long)&ppVar2[5].on_exchange + 1),(uint8_t *)(ppVar2 + 1),curve);
    *_ctx = ppVar2;
    pubkey->base = (uint8_t *)(ppVar2 + 5);
    pubkey->len = 0x41;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int secp256r1_create_key_exchange(ptls_key_exchange_context_t **_ctx, ptls_iovec_t *pubkey)
{
    struct st_secp256r1_key_exhchange_t *ctx;

    if ((ctx = (struct st_secp256r1_key_exhchange_t *)malloc(sizeof(*ctx))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->super = (ptls_key_exchange_context_t){secp256r1_on_exchange};
    ctx->pub[0] = TYPE_UNCOMPRESSED_PUBLIC_KEY;
    uECC_make_key(ctx->pub + 1, ctx->priv, uECC_secp256r1());

    *_ctx = &ctx->super;
    *pubkey = ptls_iovec_init(ctx->pub, sizeof(ctx->pub));
    return 0;
}